

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_query.hpp
# Opt level: O0

type jsoncons::jsonpath::
     json_replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,C_A_T_C_H_T_E_S_T_5()::__0>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               string_view_type *path,anon_class_16_1_ba1d73fd *callback,
               custom_functions<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               *funcs)

{
  result_options a;
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_RDI;
  result_options options;
  anon_class_8_1_dda845c3 f;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  context;
  path_expression_type expr;
  evaluator_type evaluator;
  __single_object resources;
  reference in_stack_00000288;
  path_node_type *in_stack_00000290;
  reference in_stack_00000298;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_000002a0;
  path_expression<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_000002a8;
  anon_class_8_1_dda845c3 in_stack_000002b0;
  result_options in_stack_000002c0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe00;
  allocator_type *alloc;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe30;
  custom_functions<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe38;
  string_view_type *in_stack_fffffffffffffe48;
  static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe50;
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe58;
  allocator<char> local_181 [192];
  allocator_type local_c1 [185];
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *local_8;
  
  local_8 = in_RDI;
  std::
  make_unique<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::jsonpath::custom_functions<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const&>
            (in_stack_fffffffffffffe38);
  alloc = local_c1;
  std::allocator<char>::allocator();
  detail::
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::jsonpath_evaluator
            (in_stack_fffffffffffffe00,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  std::allocator<char>::~allocator(local_c1);
  std::
  unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ::operator*((unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffe00);
  detail::
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::compile(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::allocator<char>::allocator();
  detail::
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::eval_context(in_stack_fffffffffffffe30,alloc);
  std::allocator<char>::~allocator(local_181);
  a = operator|(nodups,path);
  operator|(a,sort_descending);
  basic_path_node<char>::basic_path_node((basic_path_node<char> *)local_8);
  detail::
  path_expression<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
  ::
  evaluate<jsoncons::jsonpath::json_replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,C_A_T_C_H_T_E_S_T_5()::__0>(jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::string_view_type_const&,C_A_T_C_H_T_E_S_T_5()::__0,jsoncons::jsonpath::custom_functions<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>const&)::_lambda(jsoncons::jsonpath::basic_path_node<char>const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&)_1_>
            (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290,
             in_stack_00000288,in_stack_000002b0,in_stack_000002c0);
  detail::
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                   *)local_8);
  detail::
  path_expression<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::~path_expression((path_expression<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                      *)0x6c6d3f);
  detail::
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  ::~jsonpath_evaluator(local_8);
  std::
  unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *)local_8);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_binary_function_object<BinaryCallback,const typename Json::string_type&,Json&>::value,void>::type
    json_replace(Json& root, const typename Json::string_view_type& path , BinaryCallback callback, 
                 const custom_functions<Json>& funcs = custom_functions<Json>())
    {
        using jsonpath_traits_type = jsoncons::jsonpath::legacy_jsonpath_traits<Json, Json&>;

        using value_type = typename jsonpath_traits_type::value_type;
        using reference = typename jsonpath_traits_type::reference;
        using evaluator_type = typename jsonpath_traits_type::evaluator_type;
        using path_expression_type = typename jsonpath_traits_type::path_expression_type;
        using path_node_type = typename jsonpath_traits_type::path_node_type;

        auto resources = jsoncons::make_unique<jsoncons::jsonpath::detail::static_resources<value_type>>(funcs);
        evaluator_type evaluator;
        path_expression_type expr = evaluator.compile(*resources, path);

        jsoncons::jsonpath::detail::eval_context<Json,reference> context;

        auto f = [&callback](const path_node_type& path, reference val)
        {
            callback(to_basic_string(path), val);
        };
        result_options options = result_options::nodups | result_options::path | result_options::sort_descending;
        expr.evaluate(context, root, path_node_type{}, root, f, options);
    }